

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Teleport.cpp
# Opt level: O2

int Teleport::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  ulong in_RAX;
  EffectData *pEVar2;
  SharedMemoryHandle *pSVar3;
  int iVar4;
  char *__assertion;
  uint uVar5;
  Stream *this;
  ulong uVar6;
  ulong uStack_38;
  float x;
  
  uStack_38 = in_RAX;
  pEVar2 = UnityAudioEffectState::GetEffectData<Teleport::EffectData>(state);
  uVar5 = (uint)pEVar2->p[0];
  if ((int)uVar5 < 0) {
    __assertion = "stream >= 0";
    uVar5 = 0x3f;
  }
  else {
    if (uVar5 < 8) {
      pSVar3 = GetSharedMemory();
      this = pSVar3->data->streams + uVar5;
      if (0.5 <= pEVar2->p[1]) {
        for (uVar6 = 0; outchannels * length != uVar6; uVar6 = uVar6 + 1) {
          fVar1 = inbuffer[uVar6];
          iVar4 = this->writepos + 1;
          if (this->writepos == 0x15887) {
            iVar4 = 0;
          }
          this->buffer[iVar4] = pEVar2->p[3] * fVar1;
          this->writepos = iVar4;
          outbuffer[uVar6] = fVar1 * pEVar2->p[2];
        }
      }
      else {
        for (uVar6 = 0; outchannels * length != uVar6; uVar6 = uVar6 + 1) {
          uStack_38 = uStack_38 & 0xffffffff;
          Stream::Read(this,&x);
          outbuffer[uVar6] = inbuffer[uVar6] * pEVar2->p[2] + x * pEVar2->p[3];
        }
      }
      return 0;
    }
    __assertion = "stream < Teleport::NUMSTREAMS";
    uVar5 = 0x40;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                ,uVar5,
                "int Teleport::ProcessCallback(UnityAudioEffectState *, float *, float *, unsigned int, int, int)"
               );
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        int stream = (int)data->p[P_STREAM];
        assert(stream >= 0);
        assert(stream < Teleport::NUMSTREAMS);

        SharedMemoryHandle& shared = GetSharedMemory();
        Stream& s = shared->streams[stream];

        length *= outchannels;
        if (data->p[P_SEND] >= 0.5f)
        {
            for (unsigned int n = 0; n < length; n++)
            {
                float x = inbuffer[n];
                s.Feed(x * data->p[P_TELEPORTGAIN]);
                outbuffer[n] = x * data->p[P_INPUTGAIN];
            }
        }
        else
        {
            for (unsigned int n = 0; n < length; n++)
            {
                float x = 0.0f;
                s.Read(x);
                outbuffer[n] = inbuffer[n] * data->p[P_INPUTGAIN] + x * data->p[P_TELEPORTGAIN];
            }
        }

        return UNITY_AUDIODSP_OK;
    }